

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *mat,
            scalar_sum_op<double,_double> *func)

{
  CoeffReturnType pdVar1;
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RSI;
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDI;
  Index index_3;
  Index index_2;
  Index index_1;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  int packetAlignment;
  Index packetSize;
  Index size;
  double (*in_stack_fffffffffffffef8) [2];
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_ffffffffffffff00;
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *prVar2;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_80;
  double local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  undefined4 local_24;
  undefined8 local_20;
  Index local_18;
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_10;
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::size
                       ((redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x1440f4);
  local_20 = 2;
  local_24 = 0x10;
  redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::nestedExpression(local_8);
  local_30 = first_default_aligned<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x144128);
  local_38 = ((local_18 - local_30) / 4) * 4;
  local_40 = ((local_18 - local_30) / 2) * 2;
  local_48 = local_30 + local_38;
  local_50 = local_30 + local_40;
  if (local_40 == 0) {
    pdVar1 = redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                       (in_stack_ffffffffffffff00,(Index)in_stack_fffffffffffffef8);
    local_58 = *pdVar1;
    for (local_d0 = 1; local_d0 < local_18; local_d0 = local_d0 + 1) {
      prVar2 = local_10;
      pdVar1 = redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                         (local_10,(Index)in_stack_fffffffffffffef8);
      local_58 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)prVar2,&local_58,pdVar1);
    }
  }
  else {
    redux_evaluator<Eigen::Matrix<double,-1,-1,0,-1,-1>>::packet<16,double__vector(2)>
              (in_stack_ffffffffffffff00,(Index)in_stack_fffffffffffffef8);
    if (2 < local_40) {
      redux_evaluator<Eigen::Matrix<double,-1,-1,0,-1,-1>>::packet<16,double__vector(2)>
                (in_stack_ffffffffffffff00,(Index)in_stack_fffffffffffffef8);
      local_80 = local_30;
      while (local_80 = local_80 + 4, local_80 < local_48) {
        redux_evaluator<Eigen::Matrix<double,-1,-1,0,-1,-1>>::packet<16,double__vector(2)>
                  (in_stack_ffffffffffffff00,(Index)in_stack_fffffffffffffef8);
        scalar_sum_op<double,double>::packetOp<double__vector(2)>
                  ((scalar_sum_op<double,_double> *)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,(double (*) [2])0x144272);
        redux_evaluator<Eigen::Matrix<double,-1,-1,0,-1,-1>>::packet<16,double__vector(2)>
                  (in_stack_ffffffffffffff00,(Index)in_stack_fffffffffffffef8);
        scalar_sum_op<double,double>::packetOp<double__vector(2)>
                  ((scalar_sum_op<double,_double> *)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,(double (*) [2])0x1442be);
      }
      scalar_sum_op<double,double>::packetOp<double__vector(2)>
                ((scalar_sum_op<double,_double> *)in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8,(double (*) [2])0x1442fd);
      if (local_48 < local_50) {
        redux_evaluator<Eigen::Matrix<double,-1,-1,0,-1,-1>>::packet<16,double__vector(2)>
                  (in_stack_ffffffffffffff00,(Index)in_stack_fffffffffffffef8);
        scalar_sum_op<double,double>::packetOp<double__vector(2)>
                  ((scalar_sum_op<double,_double> *)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,(double (*) [2])0x144357);
      }
    }
    local_58 = scalar_sum_op<double,double>::predux<double__vector(2)>
                         ((scalar_sum_op<double,_double> *)in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8);
    for (local_c0 = 0; prVar2 = local_10, local_c0 < local_30; local_c0 = local_c0 + 1) {
      pdVar1 = redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                         (in_stack_ffffffffffffff00,(Index)in_stack_fffffffffffffef8);
      local_58 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)prVar2,&local_58,pdVar1);
    }
    for (local_c8 = local_50; prVar2 = local_10, local_c8 < local_18; local_c8 = local_c8 + 1) {
      pdVar1 = redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                         (in_stack_ffffffffffffff00,(Index)in_stack_fffffffffffffef8);
      local_58 = scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)prVar2,&local_58,pdVar1);
    }
  }
  return local_58;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }